

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RepulsivePower.cpp
# Opt level: O2

void __thiscall OpenMD::RepulsivePower::calcForce(RepulsivePower *this,InteractionData *idat)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  pointer piVar5;
  long lVar6;
  long lVar7;
  double __x;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  Vector<double,_3U> local_50;
  Vector<double,_3U> local_38;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  piVar5 = (this->RPtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = *(long *)&(this->MixingMap).
                    super__Vector_base<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>,_std::allocator<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[piVar5[idat->atid1]].
                    super__Vector_base<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>
                    ._M_impl.super__Vector_impl_data;
  lVar7 = (long)piVar5[idat->atid2] * 0x20;
  dVar1 = *(double *)(lVar6 + 8 + lVar7);
  dVar2 = *(double *)(lVar6 + 0x10 + lVar7);
  iVar4 = *(int *)(lVar6 + 0x18 + lVar7);
  __x = 1.0 / (idat->rij * dVar2);
  dVar10 = (double)iVar4;
  dVar8 = pow(__x,dVar10);
  dVar12 = (double)-iVar4;
  if (idat->shiftedPot == true) {
    dVar9 = pow(1.0 / (idat->rcut * dVar2),dVar10);
    dVar13 = 0.0;
  }
  else {
    dVar9 = 0.0;
    dVar13 = 0.0;
    if (idat->shiftedForce == true) {
      dVar13 = 1.0 / (idat->rcut * dVar2);
      dVar9 = pow(dVar13,dVar10);
      dVar13 = dVar13 * dVar9 * dVar12;
      dVar9 = (idat->rij - idat->rcut) * dVar13 * dVar2 + dVar9;
    }
  }
  dVar10 = idat->sw;
  dVar3 = idat->vdwMult;
  dVar11 = (dVar8 - dVar9) * dVar1 * dVar3;
  dVar9 = dVar10 * dVar11;
  idat->vpair = dVar11 + idat->vpair;
  (idat->pot).data_[1] = (idat->pot).data_[1] + dVar9;
  if (idat->isSelected == true) {
    (idat->selePot).data_[1] = dVar9 + (idat->selePot).data_[1];
  }
  operator*(&local_50,&(idat->d).super_Vector<double,_3U>,
            dVar2 * dVar1 * dVar3 * dVar10 * (dVar8 * __x * dVar12 - dVar13));
  operator/(&local_38,&local_50,idat->rij);
  Vector<double,_3U>::add(&(idat->f1).super_Vector<double,_3U>,&local_38);
  return;
}

Assistant:

void RepulsivePower::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    RPInteractionData& mixer =
        MixingMap[RPtids[idat.atid1]][RPtids[idat.atid2]];
    RealType sigmai  = mixer.sigmai;
    RealType epsilon = mixer.epsilon;
    int nRep         = mixer.nRep;

    RealType ros;
    RealType rcos;
    RealType myPot    = 0.0;
    RealType myPotC   = 0.0;
    RealType myDeriv  = 0.0;
    RealType myDerivC = 0.0;

    ros = idat.rij * sigmai;

    getNRepulsionFunc(ros, nRep, myPot, myDeriv);

    if (idat.shiftedPot) {
      rcos = idat.rcut * sigmai;
      getNRepulsionFunc(rcos, nRep, myPotC, myDerivC);
      myDerivC = 0.0;
    } else if (idat.shiftedForce) {
      rcos = idat.rcut * sigmai;
      getNRepulsionFunc(rcos, nRep, myPotC, myDerivC);
      myPotC = myPotC + myDerivC * (idat.rij - idat.rcut) * sigmai;
    } else {
      myPotC   = 0.0;
      myDerivC = 0.0;
    }

    RealType pot_temp = idat.vdwMult * epsilon * (myPot - myPotC);
    idat.vpair += pot_temp;

    RealType dudr =
        idat.sw * idat.vdwMult * epsilon * (myDeriv - myDerivC) * sigmai;

    idat.pot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;
    if (idat.isSelected) idat.selePot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;

    idat.f1 += idat.d * dudr / idat.rij;

    return;
  }